

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O0

IndentInfo Omega_h::build_indent_info(Language *language)

{
  IndentInfo IVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ParserFail *pPVar5;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [38];
  undefined1 local_102;
  allocator local_101;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [35];
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  const_reference local_30;
  value_type *token;
  Language *pLStack_20;
  int tok_i;
  Language *language_local;
  IndentInfo out;
  
  language_local._0_4_ = (uint)language_local & 0xffffff00;
  language_local._4_4_ = -1;
  out.is_sensitive = true;
  out._1_3_ = 0xffffff;
  out.indent_token = -1;
  pLStack_20 = language;
  for (token._4_4_ = 0; iVar2 = token._4_4_,
      iVar4 = size<Omega_h::Language::Token>(&pLStack_20->tokens), iVar2 < iVar4;
      token._4_4_ = token._4_4_ + 1) {
    local_30 = at<Omega_h::Language::Token>(&pLStack_20->tokens,token._4_4_);
    bVar3 = std::operator==(&local_30->name,"INDENT");
    if (bVar3) {
      if (language_local._4_4_ != -1) {
        local_65 = 1;
        pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_50,"ERROR: Language has two or more INDENT tokens\n",&local_51);
        ParserFail::ParserFail(pPVar5,(string *)local_50);
        local_65 = 0;
        __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
      }
      language_local._4_4_ = token._4_4_;
      language_local._0_4_ = CONCAT31(language_local._1_3_,1);
    }
    else {
      bVar3 = std::operator==(&local_30->name,"DEDENT");
      if (bVar3) {
        if (out._0_4_ != -1) {
          local_8a = 1;
          pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_88,"ERROR: Language has two or more DEDENT tokens\n",&local_89);
          ParserFail::ParserFail(pPVar5,(string *)local_88);
          local_8a = 0;
          __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        out._0_4_ = token._4_4_;
      }
      else {
        bVar3 = std::operator==(&local_30->name,"NEWLINE");
        if (bVar3) {
          if (out.indent_token != -1) {
            local_b2 = 1;
            pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_b0,"ERROR: Language has two or more NEWLINE tokens\n",&local_b1);
            ParserFail::ParserFail(pPVar5,(string *)local_b0);
            local_b2 = 0;
            __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
          }
          out.indent_token = token._4_4_;
        }
      }
    }
  }
  if ((((uint)language_local & 1) != 0) && (language_local._4_4_ == -1)) {
    local_da = 1;
    pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,"ERROR: Indentation-sensitive language has no INDENT token\n",&local_d9);
    ParserFail::ParserFail(pPVar5,(string *)local_d8);
    local_da = 0;
    __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
  }
  if ((((uint)language_local & 1) != 0) && (out._0_4_ == -1)) {
    local_102 = 1;
    pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"ERROR: Indentation-sensitive language has no DEDENT token\n",&local_101);
    ParserFail::ParserFail(pPVar5,(string *)local_100);
    local_102 = 0;
    __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
  }
  if ((((uint)language_local & 1) != 0) && (out.indent_token == -1)) {
    local_12a = 1;
    pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"ERROR: Indentation-sensitive language has no NEWLINE token\n",&local_129);
    ParserFail::ParserFail(pPVar5,(string *)local_128);
    local_12a = 0;
    __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
  }
  if ((out.indent_token <= language_local._4_4_) && (out.indent_token <= (int)out._0_4_)) {
    IVar1.indent_token = language_local._4_4_;
    IVar1._0_4_ = (uint)language_local;
    IVar1.dedent_token = out._0_4_;
    IVar1.newline_token = out.indent_token;
    return IVar1;
  }
  pPVar5 = (ParserFail *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,"ERROR: NEWLINE needs to come before all other indent tokens\n",&local_151);
  ParserFail::ParserFail(pPVar5,(string *)local_150);
  __cxa_throw(pPVar5,&ParserFail::typeinfo,ParserFail::~ParserFail);
}

Assistant:

static IndentInfo build_indent_info(Language const& language) {
  IndentInfo out;
  out.is_sensitive = false;
  out.indent_token = -1;
  out.dedent_token = -1;
  out.newline_token = -1;
  for (int tok_i = 0; tok_i < size(language.tokens); ++tok_i) {
    auto& token = at(language.tokens, tok_i);
    if (token.name == "INDENT") {
      if (out.indent_token != -1) {
        throw ParserFail("ERROR: Language has two or more INDENT tokens\n");
      }
      out.indent_token = tok_i;
      out.is_sensitive = true;
    } else if (token.name == "DEDENT") {
      if (out.dedent_token != -1) {
        throw ParserFail("ERROR: Language has two or more DEDENT tokens\n");
      }
      out.dedent_token = tok_i;
    } else if (token.name == "NEWLINE") {
      if (out.newline_token != -1) {
        throw ParserFail("ERROR: Language has two or more NEWLINE tokens\n");
      }
      out.newline_token = tok_i;
    }
  }
  if (out.is_sensitive && out.indent_token == -1) {
    throw ParserFail(
        "ERROR: Indentation-sensitive language has no INDENT token\n");
  }
  if (out.is_sensitive && out.dedent_token == -1) {
    throw ParserFail(
        "ERROR: Indentation-sensitive language has no DEDENT token\n");
  }
  if (out.is_sensitive && out.newline_token == -1) {
    throw ParserFail(
        "ERROR: Indentation-sensitive language has no NEWLINE token\n");
  }
  if (out.indent_token < out.newline_token ||
      out.dedent_token < out.newline_token) {
    throw ParserFail(
        "ERROR: NEWLINE needs to come before all other indent tokens\n");
  }
  return out;
}